

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManPrintPackingStats(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int nNumStr [5];
  
  nNumStr[4] = 0;
  nNumStr[0] = 0;
  nNumStr[1] = 0;
  nNumStr[2] = 0;
  nNumStr[3] = 0;
  if (p->vPacking == (Vec_Int_t *)0x0) {
    return;
  }
  uVar1 = Vec_IntEntry(p->vPacking,0);
  iVar4 = 1;
  uVar3 = uVar1;
  while( true ) {
    if (p->vPacking->nSize <= iVar4) {
      if (uVar3 == 0) {
        if (nNumStr[3] < 1) {
          if (nNumStr[2] < 1) {
            iVar4 = (uint)(0 < nNumStr[1]) * 2 + -1;
          }
          else {
            iVar4 = 2;
          }
        }
        else {
          iVar4 = 3;
        }
        Abc_Print(1,"Packing (N=%d)  :  ",iVar4);
        uVar3 = 0;
        for (uVar5 = 1; (long)uVar5 <= (long)iVar4; uVar5 = uVar5 + 1) {
          uVar2 = nNumStr[uVar5];
          Abc_Print(1,"%d x LUT = %d   ",uVar5 & 0xffffffff,(ulong)uVar2);
          uVar3 = uVar3 + uVar2 * (int)uVar5;
        }
        Abc_Print(1,"Total = %d   ",(ulong)uVar1);
        Abc_Print(1,"Total LUT = %d",(ulong)uVar3);
        Abc_Print(1,"\n");
        return;
      }
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x25a,"void Gia_ManPrintPackingStats(Gia_Man_t *)");
    }
    uVar2 = Vec_IntEntry(p->vPacking,iVar4);
    if (2 < uVar2 - 1) break;
    nNumStr[uVar2] = nNumStr[uVar2] + 1;
    iVar4 = iVar4 + uVar2 + 1;
    uVar3 = uVar3 - 1;
  }
  __assert_fail("Entry > 0 && Entry < 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                ,0x250,"void Gia_ManPrintPackingStats(Gia_Man_t *)");
}

Assistant:

void Gia_ManPrintPackingStats( Gia_Man_t * p )
{
    int fVerbose = 0;
    int nObjToShow = 200;
    int nNumStr[5] = {0};
    int i, k, Entry, nEntries, nEntries2, MaxSize = -1, Count = 0;
    if ( p->vPacking == NULL )
        return;
    nEntries = Vec_IntEntry( p->vPacking, 0 );
    nEntries2 = 0;
    Vec_IntForEachEntryStart( p->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        nNumStr[Entry]++;
        i++;
        if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "{ " );
        for ( k = 0; k < Entry; k++, i++ )
            if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "%d ", Vec_IntEntry(p->vPacking, i) );
        if ( fVerbose && nEntries2 < nObjToShow ) Abc_Print( 1, "}\n" );
        i--;
        nEntries2++;
    }
    assert( nEntries == nEntries2 );
    if ( nNumStr[3] > 0 )
        MaxSize = 3;
    else if ( nNumStr[2] > 0 )
        MaxSize = 2;
    else if ( nNumStr[1] > 0 )
        MaxSize = 1;
    Abc_Print( 1, "Packing (N=%d)  :  ", MaxSize );
    for ( i = 1; i <= MaxSize; i++ )
    {
        Abc_Print( 1, "%d x LUT = %d   ", i, nNumStr[i] );
        Count += i * nNumStr[i];
    }
    Abc_Print( 1, "Total = %d   ", nEntries2 );
    Abc_Print( 1, "Total LUT = %d", Count );
    Abc_Print( 1, "\n" );
}